

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O1

bool __thiscall pg::MSPMSolver::lift(MSPMSolver *this,int node,int target)

{
  int *pm;
  int d;
  int iVar1;
  Game *pGVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  char cVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint pl;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  int to;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  uint local_7c;
  uint local_74;
  
  uVar12 = (ulong)node;
  pm = this->pms + (long)this->k * uVar12;
  if ((*pm != -1) || (pm[1] != -1)) {
    this->lift_attempt = this->lift_attempt + 1;
    pGVar2 = (this->super_Solver).game;
    uVar14 = uVar12 >> 6;
    uVar3 = (pGVar2->_owner)._bits[uVar14];
    uVar7 = 1L << (uVar12 & 0x3f);
    bVar20 = (uVar3 & uVar7) == 0;
    pl = (uint)bVar20;
    bVar20 = !bVar20;
    d = pGVar2->_priority[uVar12];
    if (1 < (this->super_Solver).trace) {
      poVar8 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1mupdating node ",0x12);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,node);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,d);
      bVar21 = ((((this->super_Solver).game)->_owner)._bits[uVar14] & uVar7) == 0;
      pcVar13 = " (odd)";
      if (bVar21) {
        pcVar13 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,(ulong)bVar21 | 6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\x1b[m with current progress measure",0x21);
      pm_stream(this,(this->super_Solver).logger,pm);
      poVar8 = (this->super_Solver).logger;
      cVar6 = (char)poVar8;
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    uVar15 = (ulong)((uVar3 & uVar7) != 0);
    local_74 = 0xffffffff;
    uVar10 = (ulong)pl;
    uVar16 = (uint)bVar20;
    if (pm[uVar15] == -1) {
      local_7c = 0xffffffff;
    }
    else {
      if (1 < (this->super_Solver).trace) {
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"computing max",0xd);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      if ((1 < (this->super_Solver).trace) && ((int)pl < this->k)) {
        piVar18 = this->tmp;
        uVar9 = uVar10;
        do {
          piVar18[uVar9] = pm[uVar9];
          uVar9 = uVar9 + 2;
        } while ((long)uVar9 < (long)this->k);
      }
      if (target == -1) {
        pGVar2 = (this->super_Solver).game;
        piVar18 = pGVar2->_outedges;
        iVar1 = pGVar2->_firstouts[uVar12];
        uVar19 = piVar18[iVar1];
        local_7c = 0xffffffff;
        if (uVar19 != 0xffffffff) {
          piVar18 = piVar18 + iVar1;
          local_7c = 0xffffffff;
          local_74 = 0xffffffff;
          do {
            lVar11 = (long)(int)uVar19;
            uVar17 = local_74;
            if (this->cover[lVar11] != -2) {
              Prog(this,this->tmp,this->pms + this->k * lVar11,d,(uint)bVar20);
              if (1 < (this->super_Solver).trace) {
                poVar8 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"successor node ",0xf);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   (poVar8,((this->super_Solver).game)->_priority[lVar11]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," results in",0xb);
                pm_stream(this,(this->super_Solver).logger,this->tmp);
                poVar8 = (this->super_Solver).logger;
                cVar6 = (char)poVar8;
                std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
              }
              piVar4 = this->tmp;
              bVar21 = pm_less(this,pm,piVar4,d,uVar16);
              if (bVar21) {
                uVar9 = uVar15;
                if ((int)uVar16 < this->k) {
                  do {
                    pm[uVar9] = piVar4[uVar9];
                    uVar9 = uVar9 + 2;
                  } while ((long)uVar9 < (long)this->k);
                }
                uVar17 = uVar19;
                if ((uVar7 & uVar3) == 0) {
                  local_7c = uVar19;
                  uVar17 = local_74;
                }
              }
            }
            local_74 = uVar17;
            uVar19 = piVar18[1];
            piVar18 = piVar18 + 1;
          } while (uVar19 != 0xffffffff);
        }
      }
      else {
        Prog(this,this->tmp,this->pms + (long)this->k * (long)target,d,(uint)bVar20);
        if (1 < (this->super_Solver).trace) {
          poVar8 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"successor node ",0xf);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,target);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[target]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," results in",0xb);
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          poVar8 = (this->super_Solver).logger;
          cVar6 = (char)poVar8;
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
        piVar18 = this->tmp;
        bVar21 = pm_less(this,pm,piVar18,d,uVar16);
        local_7c = 0xffffffff;
        if (bVar21) {
          uVar9 = uVar15;
          if ((int)uVar16 < this->k) {
            do {
              pm[uVar9] = piVar18[uVar9];
              uVar9 = uVar9 + 2;
            } while ((long)uVar9 < (long)this->k);
          }
          local_74 = -(uint)((uVar3 & uVar7) == 0) | target;
          local_7c = -(uint)((uVar3 & uVar7) != 0) | target;
        }
      }
    }
    uVar16 = local_74;
    if ((pm[uVar10] != -1) && ((target == -1 || (this->strategy[uVar12] == target)))) {
      if (1 < (this->super_Solver).trace) {
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"computing min",0xd);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      if ((1 < (this->super_Solver).trace) && ((int)(uint)bVar20 < this->k)) {
        piVar18 = this->tmp;
        do {
          piVar18[uVar15] = pm[uVar15];
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < (long)this->k);
      }
      pGVar2 = (this->super_Solver).game;
      piVar18 = pGVar2->_outedges;
      iVar1 = pGVar2->_firstouts[uVar12];
      uVar19 = piVar18[iVar1];
      if (uVar19 == 0xffffffff) {
        uVar17 = 0xffffffff;
      }
      else {
        piVar18 = piVar18 + iVar1;
        uVar17 = 0xffffffff;
        do {
          lVar11 = (long)(int)uVar19;
          if (this->cover[lVar11] != -2) {
            Prog(this,this->tmp,this->pms + this->k * lVar11,d,pl);
            if (1 < (this->super_Solver).trace) {
              poVar8 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"successor node ",0xf);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 (poVar8,((this->super_Solver).game)->_priority[lVar11]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," results in",0xb);
              pm_stream(this,(this->super_Solver).logger,this->tmp);
              poVar8 = (this->super_Solver).logger;
              cVar6 = (char)poVar8;
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
            }
            if (((uVar17 == 0xffffffff) ||
                (bVar20 = pm_less(this,this->tmp,this->best,d,pl), bVar20)) &&
               (uVar17 = uVar19, 0 < this->k)) {
              piVar4 = this->tmp;
              piVar5 = this->best;
              lVar11 = 0;
              do {
                piVar5[lVar11] = piVar4[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 < this->k);
            }
          }
          uVar19 = piVar18[1];
          piVar18 = piVar18 + 1;
        } while (uVar19 != 0xffffffff);
      }
      this->strategy[uVar12] = uVar17;
      piVar18 = this->best;
      bVar20 = pm_less(this,pm,piVar18,d,pl);
      if (bVar20) {
        if ((int)pl < this->k) {
          do {
            pm[uVar10] = piVar18[uVar10];
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < (long)this->k);
        }
        uVar16 = uVar17;
        if ((uVar3 & uVar7) != 0) {
          local_7c = uVar17;
          uVar16 = local_74;
        }
      }
    }
    if ((local_7c != 0xffffffff) || (uVar16 != 0xffffffff)) {
      if ((this->super_Solver).trace != 0) {
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;32mupdated node ",0x14);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,node);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,d);
        bVar20 = ((((this->super_Solver).game)->_owner)._bits[uVar14] & uVar7) == 0;
        pcVar13 = " (odd)";
        if (bVar20) {
          pcVar13 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,(ulong)bVar20 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m to",6);
        pm_stream(this,(this->super_Solver).logger,pm);
        poVar8 = (this->super_Solver).logger;
        cVar6 = (char)poVar8;
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
      if ((local_7c != 0xffffffff) && (*pm == -1)) {
        solve(this,node,local_7c);
      }
      if ((uVar16 != 0xffffffff) && (pm[1] == -1)) {
        solve(this,node,uVar16);
      }
      this->lift_count = this->lift_count + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool
MSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
        if (trace >= 2) logger << "computing max" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_max);

        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);

            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (cover[to] == -2) continue;
                Prog(tmp, pms + k*to, d, pl_max);

                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }

                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (cover[to] == -2) continue;
            Prog(tmp, pms + k*to, d, pl_min);

            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // check if a changed pm is now Top
        if (ch0 and pm[0] == -1) solve(node, best_ch0);
        if (ch1 and pm[1] == -1) solve(node, best_ch1);
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}